

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_1::Compressed2DTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Compressed2DTestInstance *this)

{
  int green;
  int blue;
  ParameterType *pPVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  TestContext *this_00;
  TestLog *this_01;
  TestTexture2D *pTVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  reference pvVar7;
  int *piVar8;
  undefined4 extraout_var_00;
  TextureRenderer *this_02;
  Texture2DView TVar9;
  allocator<char> local_3e1;
  string local_3e0;
  byte local_3bb;
  byte local_3ba;
  allocator<char> local_3b9;
  string local_3b8;
  RGBA local_398;
  RGBA local_394;
  deUint32 local_390;
  undefined1 local_389;
  undefined1 local_388 [7];
  bool isOk;
  ConstPixelBufferAccess *local_380;
  SurfaceAccess local_378;
  undefined1 local_358 [8];
  Surface referenceFrame;
  PixelFormat pixelFormat;
  undefined1 local_328 [8];
  IVec4 formatBitDepth;
  Vector<float,_2> local_310;
  MessageBuilder local_308;
  Sampler local_174;
  undefined1 local_138 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  ReferenceParams sampleParams;
  TextureFormatInfo formatInfo;
  TextureFormat textureFormat;
  TestTexture2D *texture;
  TestLog *log;
  Compressed2DTestInstance *this_local;
  
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  this_02 = &this->m_renderer;
  pTVar5 = util::TextureRenderer::get2DTexture(this_02,0);
  iVar2 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0xe])();
  formatInfo.lookupBias.m_data._8_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar2);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&sampleParams.baseLevel,
             (TextureFormat *)(formatInfo.lookupBias.m_data + 2));
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_2D);
  dVar3 = util::TextureRenderer::getRenderWidth(this_02);
  dVar4 = util::TextureRenderer::getRenderHeight(this_02);
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,dVar3,dVar4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_138);
  pPVar1 = this->m_testParameters;
  util::createSampler(&local_174,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_174);
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  sampleParams.super_RenderParams.colorScale.m_data[2] = formatInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = formatInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = formatInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = formatInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = formatInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = formatInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = formatInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = formatInfo.lookupScale.m_data[1];
  tcu::TestLog::operator<<(&local_308,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_308,(char (*) [27])"Compare reference value = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,sampleParams.super_RenderParams.w.m_data + 3);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_308);
  tcu::Vector<float,_2>::Vector(&local_310,0.0,0.0);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(formatBitDepth.m_data + 2),1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_138,&local_310,
             (Vec2 *)(formatBitDepth.m_data + 2));
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_138,0);
  util::TextureRenderer::renderQuad
            (&this->m_renderer,
             (Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,pvVar7,
             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4));
  pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)local_328,(TextureFormat *)&pixelFormat.blueBits);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_328,0);
  iVar2 = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_328,1);
  green = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_328,2);
  blue = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_328,3);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)&referenceFrame.m_pixels.m_cap,iVar2,green,blue,*piVar8);
  dVar3 = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  dVar4 = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  tcu::Surface::Surface((Surface *)local_358,dVar3,dVar4);
  tcu::SurfaceAccess::SurfaceAccess
            (&local_378,(Surface *)local_358,(PixelFormat *)&referenceFrame.m_pixels.m_cap);
  pTVar5 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(&this->m_texture);
  iVar2 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x11])();
  TVar9 = tcu::Texture2D::operator_cast_to_Texture2DView
                    ((Texture2D *)CONCAT44(extraout_var_00,iVar2));
  local_380 = TVar9.m_levels;
  local_388._0_4_ = TVar9.m_numLevels;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_138,0);
  glu::TextureTestUtil::sampleTexture
            (&local_378,(Texture2DView *)local_388,pvVar7,
             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4));
  local_394 = tcu::PixelFormat::getColorThreshold((PixelFormat *)&referenceFrame.m_pixels.m_cap);
  tcu::RGBA::RGBA(&local_398,1,1,1,1);
  local_390 = (deUint32)tcu::operator+(&local_394,&local_398);
  local_389 = glu::TextureTestUtil::compareImages
                        (this_01,(Surface *)local_358,
                         (Surface *)
                         &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(RGBA)local_390);
  local_3ba = 0;
  local_3bb = 0;
  if ((bool)local_389) {
    std::allocator<char>::allocator();
    local_3ba = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"Pass",&local_3b9);
    local_3bb = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_3b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Image verification failed",&local_3e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
  }
  if ((local_3bb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if ((local_3ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_3b9);
  }
  tcu::Surface::~Surface((Surface *)local_358);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_138);
  tcu::Surface::~Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Compressed2DTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(0);
	const tcu::TextureFormat		textureFormat	= texture.getTextureFormat();
	const tcu::TextureFormatInfo	formatInfo		= tcu::getTextureFormatInfo(textureFormat);

	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.samplerType		= SAMPLERTYPE_FLOAT;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= formatInfo.lookupBias;
	sampleParams.colorScale			= formatInfo.lookupScale;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	m_renderer.renderQuad(rendered, 0, &texCoord[0], sampleParams);

	// Compute reference.
	const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
	const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
	tcu::Surface			referenceFrame	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat), m_texture->getTexture(), &texCoord[0], sampleParams);

	// Compare and log.
	const bool isOk = compareImages(log, referenceFrame, rendered, pixelFormat.getColorThreshold() + tcu::RGBA(1, 1, 1, 1));

	return isOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Image verification failed");
}